

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O0

void __thiscall CTcMake::add_module_first(CTcMake *this,CTcMakeModule *mod)

{
  CTcMakeModule *in_RSI;
  long in_RDI;
  
  CTcMakeModule::set_next(in_RSI,*(CTcMakeModule **)(in_RDI + 0x30));
  *(CTcMakeModule **)(in_RDI + 0x30) = in_RSI;
  if (*(long *)(in_RDI + 0x38) == 0) {
    *(CTcMakeModule **)(in_RDI + 0x38) = in_RSI;
  }
  return;
}

Assistant:

void CTcMake::add_module_first(CTcMakeModule *mod)
{
    /* add it at the end of our list */
    mod->set_next(mod_head_);
    mod_head_ = mod;

    /* if it's the first thing in the list, it's the tail as well */
    if (mod_tail_ == 0)
        mod_tail_ = mod;
}